

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BOOLEAN __thiscall
BVSparse<Memory::HeapAllocator>::TestAndClear(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVSparseNode *pBVar2;
  Type_conflict *local_38;
  Type_conflict *prevNextField;
  
  local_38 = (Type_conflict *)0x0;
  BVar1 = '\0';
  pBVar2 = NodeFromIndex(this,i,&local_38,false);
  if (pBVar2 != (BVSparseNode *)0x0) {
    BVar1 = BVUnitT<unsigned_long>::Test(&pBVar2->data,i & 0x3f);
    BVUnitT<unsigned_long>::Clear(&pBVar2->data,i & 0x3f);
    if ((pBVar2->data).word == 0) {
      pBVar2 = DeleteNode(this,pBVar2,false);
      *local_38 = pBVar2;
    }
  }
  return BVar1;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndClear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if (current == nullptr)
    {
        return false;
    }
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = current->data.Test(bvIndex);
    current->data.Clear(bvIndex);
    if (current->data.IsEmpty())
    {
        *prevNextField = this->DeleteNode(current, false);
    }
    return bit;
}